

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFailureRepr.cpp
# Opt level: O0

string * __thiscall
CountFailureRepr::asString_abi_cxx11_(string *__return_storage_ptr__,CountFailureRepr *this)

{
  element_type *this_00;
  size_t __val;
  CountFailureRepr *this_local;
  
  this_00 = std::
            __shared_ptr_access<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->count);
  __val = oout::CountFailure::count(this_00);
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  return __return_storage_ptr__;
}

Assistant:

string CountFailureRepr::asString() const
{
	return to_string(count->count());
}